

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall TestAds::testAdsWriteReqEx(TestAds *this,string *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  test_info *ptVar2;
  pointer pcVar3;
  long lVar4;
  ostream *poVar5;
  int iVar6;
  bool bVar7;
  uint32_t outBuffer;
  uint32_t buffer;
  uint32_t bytesRead;
  uint32_t defaultValue;
  AmsAddr unknown;
  uint local_74;
  string local_70;
  long local_50;
  uint local_44;
  uint local_40 [2];
  AmsAddr local_38;
  
  local_50 = AdsPortOpenEx();
  bVar7 = local_50 != 0;
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  paVar1 = &local_70.field_2;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,bVar7,&local_70,"0 != port",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x259);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  print(&server,this->out);
  local_74 = 0xdeadbeef;
  iVar6 = 0;
  do {
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    lVar4 = AdsSyncWriteReqEx(local_50,&server,0x4020,0,4,&local_74);
    if ((lVar4 != 0) != (this->super_test_base<TestAds>).super_test_root.m_reverse_mode) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"i",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      bVar7 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
      pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
      fructose::test_root::test_assert
                ((test_root *)this,bVar7,&local_70,
                 "0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(outBuffer), &outBuffer)",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x261);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    lVar4 = AdsSyncReadReqEx2(local_50,&server,0x4020,0,4,&local_44,local_40);
    if ((lVar4 != 0) != (this->super_test_base<TestAds>).super_test_root.m_reverse_mode) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"i",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      bVar7 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
      pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
      fructose::test_root::test_assert
                ((test_root *)this,bVar7,&local_70,
                 "0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead)"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    if ((local_40[0] != 4) != (this->super_test_base<TestAds>).super_test_root.m_reverse_mode) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"i",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      bVar7 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
      pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
      fructose::test_root::test_assert
                ((test_root *)this,bVar7,&local_70,"sizeof(buffer) == bytesRead",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x269);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    if ((local_74 != local_44) != (this->super_test_base<TestAds>).super_test_root.m_reverse_mode) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"i",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      bVar7 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
      pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
      fructose::test_root::test_assert
                ((test_root *)this,bVar7,&local_70,"outBuffer == buffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x26a);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
    local_74 = ~local_74;
    iVar6 = iVar6 + 1;
  } while (iVar6 != 10);
  lVar4 = AdsSyncWriteReqEx(0,&server,0x4020,0,4,&local_74);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0x748,&local_70,
             "ADSERR_CLIENT_PORTNOTOPEN == AdsSyncWriteReqEx(0, &server, 0x4020, 0, sizeof(outBuffer), &outBuffer)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  lVar4 = AdsSyncWriteReqEx(local_50,(AmsAddr *)0x0,0x4020,0,4,&local_74);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0x749,&local_70,
             "ADSERR_CLIENT_NOAMSADDR == AdsSyncWriteReqEx(port, nullptr, 0x4020, 0, sizeof(outBuffer), &outBuffer)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x274);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  AmsNetId::AmsNetId(&local_38.netId,'\x01','\x02','\x03','\x04','\x05','\x06');
  local_38.port = 0x353;
  lVar4 = AdsSyncWriteReqEx(local_50,&local_38,0x4020,0,4,&local_74);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 7,&local_70,
             "GLOBALERR_MISSING_ROUTE == AdsSyncWriteReqEx(port, &unknown, 0x4020, 0, sizeof(outBuffer), &outBuffer)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x279);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  lVar4 = AdsSyncWriteReqEx(local_50,&server,0x4020,0,4,(void *)0x0);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0x741,&local_70,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(outBuffer), nullptr)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x27d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_74 = 0xdeadbeef;
  local_44 = 0;
  lVar4 = AdsSyncWriteReqEx(local_50,&server,0x4020,0,4,&local_74);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0,&local_70,
             "0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(outBuffer), &outBuffer)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x282);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  lVar4 = AdsSyncWriteReqEx(local_50,&server,0x4020,0,0,&local_44);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0,&local_70,
             "0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, 0, &buffer)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x283);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  lVar4 = AdsSyncReadReqEx2(local_50,&server,0x4020,0,4,&local_44,local_40);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0,&local_70,
             "0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x284);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  bVar7 = local_74 == local_44;
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,bVar7,&local_70,"outBuffer == buffer",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x285);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  lVar4 = AdsSyncWriteReqEx(local_50,&server,0,0,4,&local_74);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0x701,&local_70,
             "ADSERR_DEVICE_SRVNOTSUPP == AdsSyncWriteReqEx(port, &server, 0, 0, sizeof(outBuffer), &outBuffer)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x28d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  lVar4 = AdsSyncWriteReqEx(local_50,&server,0x4025,0x10000,4,&local_74);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0x701,&local_70,
             "ADSERR_DEVICE_SRVNOTSUPP == AdsSyncWriteReqEx(port, &server, 0x4025, 0x10000, sizeof(outBuffer), &outBuffer)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x291);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_40[1] = 0;
  lVar4 = AdsSyncWriteReqEx(local_50,&server,0x4020,0,4,local_40 + 1);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0,&local_70,
             "0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(defaultValue), &defaultValue)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x294);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  lVar4 = AdsPortCloseEx(local_50);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0,&local_70,"0 == AdsPortCloseEx(port)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x295);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void testAdsWriteReqEx(const std::string&)
    {
        const long port = AdsPortOpenEx();
        fructose_assert(0 != port);

        print(server, out);

        uint32_t bytesRead;
        uint32_t buffer;
        uint32_t outBuffer = 0xDEADBEEF;
        for (int i = 0; i < NUM_TEST_LOOPS; ++i) {
            fructose_loop_assert(i, 0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(outBuffer), &outBuffer));
            fructose_loop_assert(i, 0 == AdsSyncReadReqEx2(port,
                                                           &server,
                                                           0x4020,
                                                           0,
                                                           sizeof(buffer),
                                                           &buffer,
                                                           &bytesRead));
            fructose_loop_assert(i, sizeof(buffer) == bytesRead);
            fructose_loop_assert(i, outBuffer == buffer);
            outBuffer = ~outBuffer;
        }

        // provide out of range port
        fructose_assert(ADSERR_CLIENT_PORTNOTOPEN ==
                        AdsSyncWriteReqEx(0, &server, 0x4020, 0, sizeof(outBuffer), &outBuffer));

        // provide nullptr to AmsAddr
        fructose_assert(ADSERR_CLIENT_NOAMSADDR ==
                        AdsSyncWriteReqEx(port, nullptr, 0x4020, 0, sizeof(outBuffer), &outBuffer));

        // provide unknown AmsAddr
        AmsAddr unknown { { 1, 2, 3, 4, 5, 6 }, AMSPORT_R0_PLC_TC3 };
        fructose_assert(GLOBALERR_MISSING_ROUTE ==
                        AdsSyncWriteReqEx(port, &unknown, 0x4020, 0, sizeof(outBuffer), &outBuffer));

        // provide nullptr to writeBuffer
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(outBuffer), nullptr));

        // provide 0 length writeBuffer
        outBuffer = 0xDEADBEEF;
        buffer = 0;
        fructose_assert(0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(outBuffer), &outBuffer));
        fructose_assert(0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, 0, &buffer));
        fructose_assert(0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead));
        fructose_assert(outBuffer == buffer);

        // provide invalid indexGroup
        fructose_assert(ADSERR_DEVICE_SRVNOTSUPP == AdsSyncWriteReqEx(port,
                                                                      &server,
                                                                      0,
                                                                      0,
                                                                      sizeof(outBuffer),
                                                                      &outBuffer));

        // provide invalid indexOffset
        fructose_assert(ADSERR_DEVICE_SRVNOTSUPP ==
                        AdsSyncWriteReqEx(port, &server, 0x4025, 0x10000, sizeof(outBuffer), &outBuffer));

        const uint32_t defaultValue = 0;
        fructose_assert(0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(defaultValue), &defaultValue));
        fructose_assert(0 == AdsPortCloseEx(port));
    }